

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_make_filled_dims.cpp
# Opt level: O2

int main(void)

{
  report_errors_reminder *prVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  
  prVar1 = boost::detail::report_errors_remind();
  prVar1->called_report_errors_function = true;
  boost::detail::report_errors_remind();
  iVar3 = boost::detail::test_errors()::x;
  if (boost::detail::test_errors()::x == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No errors detected.");
    iVar3 = 0;
  }
  else {
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,boost::detail::test_errors()::x);
    poVar2 = std::operator<<(poVar2," error");
    pcVar4 = "s";
    if (iVar3 == 1) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," detected.");
    iVar3 = 1;
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar3;
}

Assistant:

int main()
{
    BOOST_TEST((is_same<
        make_filled_dims_t<0, 1>, dimensions<>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<1, 1  >, dimensions<1>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, 0  >, dimensions<0>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, dyn>, dimensions<dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<2, 1  >, dimensions<1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, 0  >, dimensions<0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, dyn>, dimensions<dyn, dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<3, 1  >, dimensions<1,   1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, 0  >, dimensions<0,   0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, dyn>, dimensions<dyn, dyn, dyn>
    >::value));

    return boost::report_errors();
}